

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_complex_copy(sexp ctx,sexp a)

{
  sexp psVar1;
  sexp res;
  sexp local_30;
  sexp_gc_var_t local_28;
  
  local_28.var = &local_30;
  local_30 = (sexp)0x43e;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  local_30 = sexp_make_complex(ctx,(a->value).type.name,(a->value).type.cpl);
  psVar1 = (a->value).type.name;
  if (((ulong)psVar1 & 3) == 0) {
    if (psVar1->tag == 0xc) {
      psVar1 = sexp_copy_bignum(ctx,(sexp)0x0,psVar1,0);
    }
    else {
      if (psVar1->tag != 0xb) goto LAB_0011bb96;
      psVar1 = sexp_make_flonum(ctx,(psVar1->value).flonum);
    }
    (a->value).type.name = psVar1;
  }
LAB_0011bb96:
  psVar1 = (a->value).type.cpl;
  if (((ulong)psVar1 & 3) == 0) {
    if (psVar1->tag == 0xc) {
      psVar1 = sexp_copy_bignum(ctx,(sexp)0x0,psVar1,0);
    }
    else {
      if (psVar1->tag != 0xb) goto LAB_0011bbca;
      psVar1 = sexp_make_flonum(ctx,(psVar1->value).flonum);
    }
    (a->value).type.cpl = psVar1;
  }
LAB_0011bbca:
  (ctx->value).context.saves = local_28.next;
  return local_30;
}

Assistant:

static sexp sexp_complex_copy (sexp ctx, sexp a) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_complex(ctx, sexp_complex_real(a), sexp_complex_imag(a));
  if (sexp_flonump(sexp_complex_real(a)))
    sexp_complex_real(a) = sexp_make_flonum(ctx, sexp_flonum_value(sexp_complex_real(a)));
  else if (sexp_bignump(sexp_complex_real(a)))
    sexp_complex_real(a) = sexp_copy_bignum(ctx, NULL, sexp_complex_real(a), 0);
  if (sexp_flonump(sexp_complex_imag(a)))
    sexp_complex_imag(a) = sexp_make_flonum(ctx, sexp_flonum_value(sexp_complex_imag(a)));
  else if (sexp_bignump(sexp_complex_imag(a)))
    sexp_complex_imag(a) = sexp_copy_bignum(ctx, NULL, sexp_complex_imag(a), 0);
  sexp_gc_release1(ctx);
  return res;
}